

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_util.cc
# Opt level: O1

string * __thiscall
google::protobuf::util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Message *message)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"type.googleapis.com","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_68);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_38 = *plVar3;
    uStack_30 = (undefined4)plVar1[3];
    uStack_2c = *(undefined4 *)((long)plVar1 + 0x1c);
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar3;
    local_48 = (long *)*plVar1;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  lVar2 = (**(code **)(*(long *)this + 0x98))(this);
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_48,**(ulong **)(lVar2 + 8));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar4) {
    lVar2 = plVar1[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_48 != &local_38) {
    operator_delete(local_48);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeUrl(const Message& message) {
  return std::string(kTypeUrlPrefix) + "/" +
         message.GetDescriptor()->full_name();
}